

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

int __thiscall efsw::String::compare(String *this,char *s)

{
  char32_t cVar1;
  char32_t cVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  String local_30;
  
  String(&local_30,s);
  uVar3 = (this->mString)._M_string_length;
  uVar4 = uVar3;
  if (local_30.mString._M_string_length < uVar3) {
    uVar4 = local_30.mString._M_string_length;
  }
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      cVar1 = (this->mString)._M_dataplus._M_p[uVar7];
      cVar2 = local_30.mString._M_dataplus._M_p[uVar7];
      if ((uint)cVar1 < (uint)cVar2) {
        iVar5 = -1;
        goto LAB_0011da5e;
      }
      if ((uint)cVar1 >= (uint)cVar2 && cVar1 != cVar2) {
        iVar5 = 1;
        goto LAB_0011da5e;
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  lVar6 = -0x80000000;
  if (-0x80000000 < (long)(uVar3 - local_30.mString._M_string_length)) {
    lVar6 = uVar3 - local_30.mString._M_string_length;
  }
  if (0x7ffffffe < lVar6) {
    lVar6 = 0x7fffffff;
  }
  iVar5 = (int)lVar6;
LAB_0011da5e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.mString._M_dataplus._M_p != &local_30.mString.field_2) {
    operator_delete(local_30.mString._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

int String::compare( const char* s ) const {
	return compare( String( s ) );
}